

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b802::
ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node48ShrinkToNode16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *verifier_00;
  undefined1 local_148 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  anon_class_8_1_54a3980b local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  AssertHelper local_20;
  
  local_50.k = 0x85;
  verifier_00 = (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)0x0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_148,false);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_148,verifier_00);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48.field_2._M_allocated_capacity = 0;
  local_48.field_2._8_8_ = 0;
  local_48._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    anon_func::anon_class_8_1_54a3980b::operator()
              (&local_50,
               (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)local_148);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&local_48,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
            );
  testing::Message::Message
            ((Message *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,local_48._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=
            (&local_20,
             (Message *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  if (verifier.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)(verifier.key_views.
                           super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 8))();
  }
  std::__cxx11::string::~string((string *)&local_48);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_148);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node48ShrinkToNode16) {
  oom_remove_test<TypeParam>(
      2,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(0x80, 17);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({17, 0, 0, 1, 0});
        verifier.assert_shrinking_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      0x85,
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_shrinking_inodes({0, 0, 1, 0});
        verifier.assert_node_counts({16, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}